

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_search_fwdtree.c
# Opt level: O0

void init_search_tree(ngram_search_t *ngs)

{
  short sVar1;
  short sVar2;
  int iVar3;
  dict_t *d;
  int iVar4;
  int iVar5;
  int32 *piVar6;
  void *ptr;
  root_chan_t *prVar7;
  long lVar8;
  char *local_60;
  int ph1;
  int ph0;
  bitvec_t *dimap;
  dict_t *dict;
  int32 n_ci;
  int32 n_words;
  int32 i;
  int32 ndiph;
  int32 w;
  ngram_search_t *ngs_local;
  
  d = (ngs->base).dict;
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
          ,0x49,"Initializing search tree\n");
  iVar3 = (ngs->base).n_words;
  piVar6 = (int32 *)__ckd_calloc__((long)iVar3,4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                                   ,0x4c);
  ngs->homophone_set = piVar6;
  n_words = 0;
  ngs->n_1ph_words = 0;
  iVar5 = ((ngs->base).acmod)->mdef->n_ciphone;
  ptr = __ckd_calloc__((long)((iVar5 * iVar5 + 0x1f) / 0x20),4,
                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                       ,0x53);
  for (i = 0; i < iVar3; i = i + 1) {
    iVar4 = dict_real_word(d,i);
    if (iVar4 != 0) {
      if (d->word[i].pronlen == 1) {
        ngs->n_1ph_words = ngs->n_1ph_words + 1;
      }
      else {
        sVar1 = *d->word[i].ciphone;
        sVar2 = d->word[i].ciphone[1];
        if (((ulong)*(uint *)((long)ptr + (long)((sVar1 * iVar5 + (int)sVar2) / 0x20) * 4) &
            1L << ((char)sVar1 * (char)iVar5 + (char)sVar2 & 0x1fU)) == 0) {
          lVar8 = (long)((sVar1 * iVar5 + (int)sVar2) / 0x20);
          *(uint *)((long)ptr + lVar8 * 4) =
               *(uint *)((long)ptr + lVar8 * 4) |
               (uint)(1L << ((char)sVar1 * (char)iVar5 + (char)sVar2 & 0x1fU));
          n_words = n_words + 1;
        }
      }
    }
  }
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
          ,100,"%d unique initial diphones\n",(ulong)(uint)n_words);
  ckd_free(ptr);
  ngs->n_1ph_words = (d->filler_end - d->filler_start) + 2 + ngs->n_1ph_words;
  ngs->n_root_chan_alloc = n_words + 1;
  for (i = 0; i < iVar3; i = i + 1) {
    iVar5 = dict_real_word(d,i);
    if ((iVar5 == 0) && (d->word[i].pronlen != 1)) {
      if (i < 0) {
        local_60 = (char *)0x0;
      }
      else {
        local_60 = d->word[i].word;
      }
      err_msg(ERR_WARN,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
              ,0x71,"Filler word %d = %s has more than one phone, ignoring it.\n",(ulong)(uint)i,
              local_60);
      ngs->n_1ph_words = ngs->n_1ph_words + -1;
    }
  }
  prVar7 = (root_chan_t *)
           __ckd_calloc__((long)ngs->n_root_chan_alloc,0x70,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                          ,0x78);
  ngs->root_chan = prVar7;
  for (n_ci = 0; n_ci < ngs->n_root_chan_alloc; n_ci = n_ci + 1) {
    hmm_init(ngs->hmmctx,&ngs->root_chan[n_ci].hmm,1,-1,-1);
    ngs->root_chan[n_ci].penult_phn_wid = -1;
    ngs->root_chan[n_ci].next = (chan_t *)0x0;
  }
  prVar7 = (root_chan_t *)
           __ckd_calloc__((long)ngs->n_1ph_words,0x70,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                          ,0x81);
  ngs->rhmm_1ph = prVar7;
  n_ci = 0;
  for (i = 0; i < iVar3; i = i + 1) {
    if (d->word[i].pronlen == 1) {
      ngs->rhmm_1ph[n_ci].ci2phone = (int16)((ngs->base).acmod)->mdef->sil;
      ngs->rhmm_1ph[n_ci].ciphone = *d->word[i].ciphone;
      hmm_init(ngs->hmmctx,&ngs->rhmm_1ph[n_ci].hmm,1,
               ((ngs->base).acmod)->mdef->phone[ngs->rhmm_1ph[n_ci].ciphone].ssid,
               ((ngs->base).acmod)->mdef->phone[ngs->rhmm_1ph[n_ci].ciphone].tmat);
      ngs->rhmm_1ph[n_ci].next = (chan_t *)0x0;
      ngs->word_chan[i] = (chan_t *)(ngs->rhmm_1ph + n_ci);
      n_ci = n_ci + 1;
    }
  }
  piVar6 = (int32 *)__ckd_calloc__((long)ngs->n_1ph_words,4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                                   ,0x93);
  ngs->single_phone_wid = piVar6;
  return;
}

Assistant:

static void
init_search_tree(ngram_search_t *ngs)
{
    int32 w, ndiph, i, n_words, n_ci;
    dict_t *dict = ps_search_dict(ngs);
    bitvec_t *dimap;

    E_INFO("Initializing search tree\n");

    n_words = ps_search_n_words(ngs);
    ngs->homophone_set = ckd_calloc(n_words, sizeof(*ngs->homophone_set));

    /* Find #single phone words, and #unique first diphones (#root channels) in dict. */
    ndiph = 0;
    ngs->n_1ph_words = 0;
    n_ci = bin_mdef_n_ciphone(ps_search_acmod(ngs)->mdef);
    /* Allocate a bitvector with flags for each possible diphone. */
    dimap = bitvec_alloc(n_ci * n_ci);
    for (w = 0; w < n_words; w++) {
        if (!dict_real_word(dict, w))
            continue;
        if (dict_is_single_phone(dict, w))
            ++ngs->n_1ph_words;
        else {
            int ph0, ph1;
            ph0 = dict_first_phone(dict, w);
            ph1 = dict_second_phone(dict, w);
            /* Increment ndiph the first time we see a diphone. */
            if (bitvec_is_clear(dimap, ph0 * n_ci + ph1)) {
                bitvec_set(dimap, ph0 * n_ci + ph1);
                ++ndiph;
            }
        }
    }
    E_INFO("%d unique initial diphones\n", ndiph);
    bitvec_free(dimap);

    /* Add remaining dict words (</s>, <s>, <sil>, noise words) to single-phone words */
    ngs->n_1ph_words += dict_num_fillers(dict) + 2;
    ngs->n_root_chan_alloc = ndiph + 1;
    /* Verify that these are all *actually* single-phone words,
     * otherwise really bad things will happen to us. */
    for (w = 0; w < n_words; ++w) {
        if (dict_real_word(dict, w))
            continue;
        if (!dict_is_single_phone(dict, w)) {
            E_WARN("Filler word %d = %s has more than one phone, ignoring it.\n",
                   w, dict_wordstr(dict, w));
            --ngs->n_1ph_words;
        }
    }

    /* Allocate and initialize root channels */
    ngs->root_chan =
        ckd_calloc(ngs->n_root_chan_alloc, sizeof(*ngs->root_chan));
    for (i = 0; i < ngs->n_root_chan_alloc; i++) {
        hmm_init(ngs->hmmctx, &ngs->root_chan[i].hmm, TRUE, -1, -1);
        ngs->root_chan[i].penult_phn_wid = -1;
        ngs->root_chan[i].next = NULL;
    }

    /* Permanently allocate and initialize channels for single-phone
     * words (1/word). */
    ngs->rhmm_1ph = ckd_calloc(ngs->n_1ph_words, sizeof(*ngs->rhmm_1ph));
    i = 0;
    for (w = 0; w < n_words; w++) {
        if (!dict_is_single_phone(dict, w))
            continue;
        /* Use SIL as right context for these. */
        ngs->rhmm_1ph[i].ci2phone = bin_mdef_silphone(ps_search_acmod(ngs)->mdef);
        ngs->rhmm_1ph[i].ciphone = dict_first_phone(dict, w);
        hmm_init(ngs->hmmctx, &ngs->rhmm_1ph[i].hmm, TRUE,
                 bin_mdef_pid2ssid(ps_search_acmod(ngs)->mdef, ngs->rhmm_1ph[i].ciphone),
                 bin_mdef_pid2tmatid(ps_search_acmod(ngs)->mdef, ngs->rhmm_1ph[i].ciphone));
        ngs->rhmm_1ph[i].next = NULL;

        ngs->word_chan[w] = (chan_t *) &(ngs->rhmm_1ph[i]);
        i++;
    }

    ngs->single_phone_wid = ckd_calloc(ngs->n_1ph_words,
                                       sizeof(*ngs->single_phone_wid));
}